

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O2

void anon_unknown.dwarf_1fbd58::dumpNode(Node *node,uint indent)

{
  FILE *__stream;
  ret_type C;
  Node *pNVar1;
  ret_type this;
  ret_type C_00;
  KeyValueNode *this_00;
  uint uVar2;
  char *__format;
  StringRef local_170;
  string local_160;
  iterator __begin3;
  SequenceNode local_130 [2];
  
  switch(node->TypeID) {
  case 0:
    __format = "%*s(null)\n";
    goto LAB_001618ab;
  case 1:
    this = llvm::cast<llvm::yaml::ScalarNode,llvm::yaml::Node>(node);
    __stream = _stderr;
    __begin3.Base = local_130;
    local_170 = llvm::yaml::ScalarNode::getValue(this,(SmallVectorImpl<char> *)&__begin3);
    llvm::StringRef::str_abi_cxx11_(&local_160,&local_170);
    fprintf(__stream,"%*s(scalar: \'%s\')\n",(ulong)(indent * 2),"",local_160._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&__begin3);
    break;
  default:
    fprintf(_stderr,"%*s<node: %p, unknown>\n",(ulong)(indent * 2),"");
    return;
  case 3:
    __assert_fail("0 && \"unexpected keyvalue node\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildFile.cpp"
                  ,0x46,"void (anonymous namespace)::dumpNode(llvm::yaml::Node *, unsigned int)");
  case 4:
    C_00 = llvm::cast<llvm::yaml::MappingNode,llvm::yaml::Node>(node);
    fprintf(_stderr,"%*smap:\n",(ulong)(indent * 2),"");
    __begin3.Base = (SequenceNode *)llvm::yaml::begin<llvm::yaml::MappingNode>(C_00);
    uVar2 = indent * 2 + 2;
    while (__begin3.Base != (SequenceNode *)0x0) {
      this_00 = llvm::yaml::
                basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                operator*((basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                           *)&__begin3);
      fprintf(_stderr,"%*skey:\n",(ulong)uVar2,"");
      pNVar1 = llvm::yaml::KeyValueNode::getKey(this_00);
      dumpNode(pNVar1,indent + 2);
      fprintf(_stderr,"%*svalue:\n",(ulong)uVar2,"");
      pNVar1 = llvm::yaml::KeyValueNode::getValue(this_00);
      dumpNode(pNVar1,indent + 2);
      llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
      operator++((basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> *)
                 &__begin3);
    }
    break;
  case 5:
    C = llvm::cast<llvm::yaml::SequenceNode,llvm::yaml::Node>(node);
    fprintf(_stderr,"%*ssequence:\n",(ulong)(indent * 2),"");
    __begin3 = llvm::yaml::begin<llvm::yaml::SequenceNode>(C);
    while (__begin3.Base != (SequenceNode *)0x0) {
      pNVar1 = llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
               operator*(&__begin3);
      dumpNode(pNVar1,indent + 1);
      llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::operator++
                (&__begin3);
    }
    break;
  case 6:
    __format = "%*s(alias)\n";
LAB_001618ab:
    fprintf(_stderr,__format,(ulong)(indent * 2),"");
    return;
  }
  return;
}

Assistant:

static void dumpNode(llvm::yaml::Node* node, unsigned indent) {
  switch (node->getType()) {
  default: {
    fprintf(stderr, "%*s<node: %p, unknown>\n", indent*2, "", node);
    break;
  }

  case llvm::yaml::Node::NK_Null: {
    fprintf(stderr, "%*s(null)\n", indent*2, "");
    break;
  }

  case llvm::yaml::Node::NK_Scalar: {
    llvm::yaml::ScalarNode* scalar = llvm::cast<llvm::yaml::ScalarNode>(node);
    SmallString<256> storage;
    fprintf(stderr, "%*s(scalar: '%s')\n", indent*2, "",
            scalar->getValue(storage).str().c_str());
    break;
  }

  case llvm::yaml::Node::NK_KeyValue: {
    assert(0 && "unexpected keyvalue node");
    break;
  }

  case llvm::yaml::Node::NK_Mapping: {
    llvm::yaml::MappingNode* map = llvm::cast<llvm::yaml::MappingNode>(node);
    fprintf(stderr, "%*smap:\n", indent*2, "");
    for (auto& it: *map) {
      fprintf(stderr, "%*skey:\n", (indent+1)*2, "");
      dumpNode(it.getKey(), indent+2);
      fprintf(stderr, "%*svalue:\n", (indent+1)*2, "");
      dumpNode(it.getValue(), indent+2);
    }
    break;
  }

  case llvm::yaml::Node::NK_Sequence: {
    llvm::yaml::SequenceNode* sequence =
      llvm::cast<llvm::yaml::SequenceNode>(node);
    fprintf(stderr, "%*ssequence:\n", indent*2, "");
    for (auto& it: *sequence) {
      dumpNode(&it, indent+1);
    }
    break;
  }

  case llvm::yaml::Node::NK_Alias: {
    fprintf(stderr, "%*s(alias)\n", indent*2, "");
    break;
  }
  }
}